

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteLight(ColladaExporter *this,size_t pIndex)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string idstrEscaped;
  aiLight *light;
  size_t pIndex_local;
  ColladaExporter *this_local;
  
  idstrEscaped.field_2._8_8_ = this->mScene->mLights[pIndex];
  pcVar2 = aiString::C_Str((aiString *)idstrEscaped.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,pcVar2,&local_61);
  XMLEscape((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  poVar3 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar3 = std::operator<<(poVar3,"<light id=\"");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3,"-light\" name=\"");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3,"_name\" >");
  std::operator<<(poVar3,(string *)&this->endstr);
  PushTag(this);
  poVar3 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar3 = std::operator<<(poVar3,"<technique_common>");
  std::operator<<(poVar3,(string *)&this->endstr);
  PushTag(this);
  iVar1 = *(int *)(idstrEscaped.field_2._8_8_ + 0x404);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      WriteDirectionalLight(this,(aiLight *)idstrEscaped.field_2._8_8_);
    }
    else if (iVar1 == 2) {
      WritePointLight(this,(aiLight *)idstrEscaped.field_2._8_8_);
    }
    else if (iVar1 == 3) {
      WriteSpotLight(this,(aiLight *)idstrEscaped.field_2._8_8_);
    }
    else if (iVar1 == 4) {
      WriteAmbienttLight(this,(aiLight *)idstrEscaped.field_2._8_8_);
    }
  }
  PopTag(this);
  poVar3 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar3 = std::operator<<(poVar3,"</technique_common>");
  std::operator<<(poVar3,(string *)&this->endstr);
  PopTag(this);
  poVar3 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar3 = std::operator<<(poVar3,"</light>");
  std::operator<<(poVar3,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void ColladaExporter::WriteLight(size_t pIndex){

    const aiLight *light = mScene->mLights[pIndex];
    const std::string idstrEscaped = XMLEscape(light->mName.C_Str());

    mOutput << startstr << "<light id=\"" << idstrEscaped << "-light\" name=\""
            << idstrEscaped << "_name\" >" << endstr;
    PushTag();
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    switch(light->mType){
        case aiLightSource_AMBIENT:
            WriteAmbienttLight(light);
            break;
        case aiLightSource_DIRECTIONAL:
            WriteDirectionalLight(light);
            break;
        case aiLightSource_POINT:
            WritePointLight(light);
            break;
        case aiLightSource_SPOT:
            WriteSpotLight(light);
            break;
        case aiLightSource_AREA:
        case aiLightSource_UNDEFINED:
        case _aiLightSource_Force32Bit:
            break;
    }
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;

    PopTag();
    mOutput << startstr << "</light>" << endstr;

}